

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O0

Rgba __thiscall EnvmapImage::filteredLookup(EnvmapImage *this,V3f *d,float r,int n)

{
  int in_EDX;
  Vec3<float> *in_RSI;
  int *in_RDI;
  Vec3<float> *pVVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar2;
  float fVar3;
  Vec3<float> VVar4;
  float w;
  Rgba s;
  V3f ddx;
  float wx;
  float rx;
  int x;
  V3f ddy;
  float wy;
  float ry;
  int y;
  float ca;
  float cb;
  float cg;
  float cr;
  float wt;
  V3f dy;
  V3f dx;
  _func_V2f_Box2i_ptr_V3f_ptr *dirToPos;
  Rgba c;
  int *in_stack_fffffffffffffea8;
  Vec3<float> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined1 local_124 [12];
  undefined1 local_118 [8];
  undefined1 local_110 [20];
  float local_fc;
  float local_f8;
  int local_f4;
  Vec3<float> local_f0;
  float local_e4;
  float local_e0;
  int local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  V2f *in_stack_ffffffffffffff50;
  EnvmapImage *in_stack_ffffffffffffff58;
  Vec3<float> local_a0 [3];
  Vec3<float> local_7c;
  Vec3<float> local_70 [3];
  Vec3<float> local_4c;
  Vec3<float> local_40;
  Vec3<float> local_34;
  Vec3<float> *local_28;
  int local_20;
  Rgba local_8;
  
  if (*in_RDI == 0) {
    local_28 = (Vec3<float> *)anon_unknown.dwarf_6907::dirToPosLatLong;
  }
  else {
    local_28 = (Vec3<float> *)anon_unknown.dwarf_6907::dirToPosCube;
  }
  local_20 = in_EDX;
  Imath_3_2::Vec3<float>::normalize(in_stack_fffffffffffffeb0);
  Imath_3_2::Vec3<float>::Vec3(&local_34);
  pVVar1 = &local_40;
  Imath_3_2::Vec3<float>::Vec3(pVVar1);
  std::abs((int)pVVar1);
  if (extraout_XMM0_Da <= 0.707) {
    Imath_3_2::Vec3<float>::Vec3(local_a0,1.0,0.0,0.0);
    Imath_3_2::Vec3<float>::operator%(in_RSI,in_stack_fffffffffffffeb0);
    Imath_3_2::Vec3<float>::normalized
              ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    Imath_3_2::Vec3<float>::operator*(in_RSI,(float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    Imath_3_2::Vec3<float>::operator=(&local_34,&local_7c);
  }
  else {
    Imath_3_2::Vec3<float>::Vec3(local_70,0.0,1.0,0.0);
    Imath_3_2::Vec3<float>::operator%(in_RSI,in_stack_fffffffffffffeb0);
    Imath_3_2::Vec3<float>::normalized
              ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    Imath_3_2::Vec3<float>::operator*(in_RSI,(float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    Imath_3_2::Vec3<float>::operator=(&local_34,&local_4c);
  }
  Imath_3_2::Vec3<float>::operator%(in_RSI,in_stack_fffffffffffffeb0);
  Imath_3_2::Vec3<float>::normalized
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  Imath_3_2::Vec3<float>::operator*(in_RSI,(float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  pVVar1 = &local_40;
  Imath_3_2::Vec3<float>::operator=(pVVar1,(Vec3<float> *)&stack0xffffffffffffff54);
  local_c8 = 0.0;
  local_cc = 0.0;
  local_d0 = 0.0;
  local_d4 = 0.0;
  local_d8 = 0.0;
  for (local_dc = 0; local_dc < local_20; local_dc = local_dc + 1) {
    local_e0 = (float)(local_dc * 2 + 2) / (float)(local_20 + 1) - 1.0;
    std::abs((int)pVVar1);
    local_e4 = 1.0 - extraout_XMM0_Da_00;
    pVVar1 = &local_f0;
    Imath_3_2::operator*((float)((ulong)in_RSI >> 0x20),in_stack_fffffffffffffeb0);
    for (local_f4 = 0; local_f4 < local_20; local_f4 = local_f4 + 1) {
      local_f8 = (float)(local_f4 * 2 + 2) / (float)(local_20 + 1) - 1.0;
      std::abs((int)pVVar1);
      local_fc = 1.0 - extraout_XMM0_Da_01;
      Imath_3_2::operator*((float)((ulong)in_RSI >> 0x20),in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffea8 = in_RDI + 1;
      in_stack_fffffffffffffeb0 = local_28;
      Imath_3_2::Vec3<float>::operator+(in_RSI,local_28);
      VVar4 = Imath_3_2::Vec3<float>::operator+(in_RSI,in_stack_fffffffffffffeb0);
      (*(code *)in_stack_fffffffffffffeb0)
                (VVar4._0_8_,VVar4.z,local_118,in_stack_fffffffffffffea8,local_124);
      local_110._0_8_ = sample(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      fVar2 = local_fc * local_e4;
      local_c8 = fVar2 + local_c8;
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffeb0);
      local_cc = fVar3 * fVar2 + local_cc;
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffeb0);
      local_d0 = fVar3 * fVar2 + local_d0;
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffeb0);
      local_d4 = fVar3 * fVar2 + local_d4;
      pVVar1 = (Vec3<float> *)(local_110 + 6);
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffeb0);
      local_d8 = fVar3 * fVar2 + local_d8;
    }
  }
  local_c8 = 1.0 / local_c8;
  Imf_3_2::Rgba::Rgba(&local_8);
  fVar2 = (float)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffffeb0,fVar2);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffffeb0,fVar2);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffffeb0,fVar2);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffffeb0,fVar2);
  return local_8;
}

Assistant:

Rgba
EnvmapImage::filteredLookup (V3f d, float r, int n) const
{
    //
    // Filtered environment map lookup: Take n by n point samples
    // from the environment map, clustered around direction d, and
    // combine the samples with a tent filter.
    //

    //
    // Depending on the type of map, pick an appropriate function
    // to convert 3D directions to 2D pixel poitions.
    //

    V2f (*dirToPos) (const Box2i&, const V3f&);

    if (_type == ENVMAP_LATLONG)
        dirToPos = dirToPosLatLong;
    else
        dirToPos = dirToPosCube;

    //
    // Pick two vectors, dx and dy, of length r, that are orthogonal
    // to the lookup direction, d, and to each other.
    //

    d.normalize ();
    V3f dx, dy;

    if (abs (d.x) > 0.707f)
        dx = (d % V3f (0, 1, 0)).normalized () * r;
    else
        dx = (d % V3f (1, 0, 0)).normalized () * r;

    dy = (d % dx).normalized () * r;

    //
    // Take n by n point samples from the map, and add them up.
    // The directions for the point samples are all within the pyramid
    // defined by the vectors d-dy-dx, d-dy+dx, d+dy-dx, d+dy+dx.
    //

    float wt = 0;

    float cr = 0;
    float cg = 0;
    float cb = 0;
    float ca = 0;

    for (int y = 0; y < n; ++y)
    {
        float ry = float (2 * y + 2) / float (n + 1) - 1;
        float wy = 1 - abs (ry);
        V3f   ddy (ry * dy);

        for (int x = 0; x < n; ++x)
        {
            float rx = float (2 * x + 2) / float (n + 1) - 1;
            float wx = 1 - abs (rx);
            V3f   ddx (rx * dx);

            Rgba s = sample (dirToPos (_dataWindow, d + ddx + ddy));

            float w = wx * wy;
            wt += w;

            cr += s.r * w;
            cg += s.g * w;
            cb += s.b * w;
            ca += s.a * w;
        }
    }

    wt = 1 / wt;

    Rgba c;

    c.r = cr * wt;
    c.g = cg * wt;
    c.b = cb * wt;
    c.a = ca * wt;

    return c;
}